

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O1

bool __thiscall Catch::RunningSection::hasUntestedSections(RunningSection *this)

{
  bool bVar1;
  pointer ppRVar2;
  bool bVar3;
  
  bVar3 = true;
  if (this->m_state != Unknown) {
    ppRVar2 = (this->m_subSections).
              super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>.
              _M_impl.super__Vector_impl_data._M_start;
    bVar3 = ppRVar2 !=
            (this->m_subSections).
            super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
    if (bVar3) {
      bVar1 = hasUntestedSections(*ppRVar2);
      while (!bVar1) {
        ppRVar2 = ppRVar2 + 1;
        bVar1 = ppRVar2 ==
                (this->m_subSections).
                super__Vector_base<Catch::RunningSection_*,_std::allocator<Catch::RunningSection_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
        bVar3 = !bVar1;
        if (bVar1) {
          return bVar3;
        }
        bVar1 = hasUntestedSections(*ppRVar2);
      }
    }
  }
  return bVar3;
}

Assistant:

bool hasUntestedSections() const {
            if( m_state == Unknown )
                return true;
            for(    SubSections::const_iterator it = m_subSections.begin();
                    it != m_subSections.end();
                    ++it)
                if( (*it)->hasUntestedSections() )
                    return true;
            return false;
        }